

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

char ON_String::MapCharacterOrdinal(ON_StringMapOrdinalType map_type,char c)

{
  char cVar1;
  byte bVar2;
  
  if (map_type != MinimumOrdinal) {
    if (map_type == LowerOrdinal) {
      bVar2 = c | 0x20;
      if (0x19 < (byte)(c + 0xbfU)) {
        bVar2 = c;
      }
      return bVar2;
    }
    if (map_type != UpperOrdinal) {
      return c;
    }
  }
  cVar1 = c + -0x20;
  if (0x19 < (byte)(c + 0x9fU)) {
    cVar1 = c;
  }
  return cVar1;
}

Assistant:

char ON_String::MapCharacterOrdinal(
  ON_StringMapOrdinalType map_type,
  char c
  )
{
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    if (c >= 'a' && c <= 'z')
      return c - 0x20;
    break;
  case ON_StringMapOrdinalType::LowerOrdinal:
    if (c >= 'A' && c <= 'Z')
      return c + 0x20;
    break;
  default:
    break;
  }

  return c;
}